

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

int __thiscall CS248::OSDText::init(OSDText *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLuint GVar2;
  GLint GVar3;
  GLint GVar4;
  ostream *poVar5;
  void *pvVar6;
  ulong __n;
  char *pcVar7;
  size_t size;
  string decoded;
  OSDText *in_stack_000000b0;
  string encoded;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  GLuint program;
  OSDText *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  string local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  OSDText *local_10;
  int local_4;
  
  local_11 = (byte)ctx & 1;
  this->use_hdpi = (bool)local_11;
  local_10 = this;
  iVar1 = FT_Init_FreeType(this->ft);
  if (iVar1 == 0) {
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    std::operator+(in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    std::operator+(in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    std::operator+(in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    program = (GLuint)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    base64_decode((string *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    __n = std::__cxx11::string::size();
    pcVar7 = (char *)operator_new__(__n);
    this->font = pcVar7;
    pcVar7 = this->font;
    pvVar6 = (void *)std::__cxx11::string::c_str();
    memcpy(pcVar7,pvVar6,__n);
    iVar1 = FT_New_Memory_Face(*this->ft,this->font,__n,0,this->face);
    if (iVar1 == 0) {
      GVar2 = compile_shaders(in_stack_000000b0);
      this->program = GVar2;
      if (this->program == 0) {
        local_4 = -1;
      }
      else {
        GVar3 = get_attribu(in_stack_fffffffffffffec0,program,
                            (char *)CONCAT44(GVar2,in_stack_fffffffffffffeb0));
        this->attribute_coord = GVar3;
        GVar4 = get_uniform(in_stack_fffffffffffffec0,program,(char *)CONCAT44(GVar2,GVar3));
        this->uniform_tex = GVar4;
        GVar3 = get_uniform(in_stack_fffffffffffffec0,program,(char *)CONCAT44(GVar2,GVar3));
        this->uniform_color = GVar3;
        if (((this->attribute_coord == -1) || (this->uniform_tex == -1)) ||
           (this->uniform_color == -1)) {
          local_4 = -1;
        }
        else {
          (*__glewGenBuffers)(1,&this->vbo);
          (*__glewGenVertexArrays)(1,&this->vertexAttribArray);
          local_4 = 0;
        }
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,this->font);
      poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
      poVar5 = std::operator<<(poVar5,"[CS248] ");
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"Cannot open font");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
      local_4 = -1;
    }
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_38);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar5 = std::operator<<(poVar5,"[CS248] ");
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"Cannot init freetype library");
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::flush<char,std::char_traits<char>>);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int OSDText::init(bool use_hdpi) {

    this->use_hdpi = use_hdpi;

    // initialize font library
    if (FT_Init_FreeType(ft)) {
      out_err("Cannot init freetype library");
      return -1;
    }

    // decode font and keep in memory
    string encoded = osdfont_base64_1 + osdfont_base64_2 + osdfont_base64_3 
                      + osdfont_base64_4 + osdfont_base64_5 + osdfont_base64_6;
    string decoded = base64_decode(encoded);
    size_t size = decoded.size();
    font = new char[size];
    memcpy(font, decoded.c_str(), size);

    // initialize font face
    if (FT_New_Memory_Face(*ft, (const FT_Byte*) font, size, 0, face)) {
        cerr << font;
        out_err("Cannot open font");
        return -1;
    }

    // compile shaders
    program = compile_shaders();
    if (program) {
        attribute_coord = get_attribu ( program, "coord" );
        uniform_tex     = get_uniform ( program, "tex"   );
        uniform_color   = get_uniform ( program, "color" );
        if (attribute_coord == -1 || uniform_tex == -1 || uniform_color == -1) {
            return -1;
        }
    } else return -1;

    // create the vbo
    glGenBuffers(1, &vbo);

    // vertex array
    glGenVertexArrays(1, &vertexAttribArray);

    return 0;
}